

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sumFinalize(sqlite3_context *context)

{
  double *pdVar1;
  Mem *pMVar2;
  double val;
  
  if ((short)context->pMem->flags < 0) {
    pdVar1 = (double *)context->pMem->z;
  }
  else {
    pdVar1 = (double *)createAggContext(context,0);
  }
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[3])) {
    if (*(char *)(pdVar1 + 4) != '\0') {
      if (*(char *)((long)pdVar1 + 0x21) != '\0') {
        context->isError = 1;
        sqlite3VdbeMemSetStr
                  (context->pOut,"integer overflow",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        return;
      }
      val = *pdVar1;
      if ((ulong)ABS(pdVar1[1]) < 0x7ff0000000000000) {
        val = pdVar1[1] + val;
        pMVar2 = context->pOut;
      }
      else {
        pMVar2 = context->pOut;
      }
      sqlite3VdbeMemSetDouble(pMVar2,val);
      return;
    }
    pMVar2 = context->pOut;
    if ((pMVar2->flags & 0x9000) != 0) {
      vdbeReleaseAndSetInt64(pMVar2,(i64)pdVar1[2]);
      return;
    }
    (pMVar2->u).i = (i64)pdVar1[2];
    pMVar2->flags = 4;
  }
  return;
}

Assistant:

static void sumFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    if( p->approx ){
      if( p->ovrfl ){
        sqlite3_result_error(context,"integer overflow",-1);
      }else if( !sqlite3IsOverflow(p->rErr) ){
        sqlite3_result_double(context, p->rSum+p->rErr);
      }else{
        sqlite3_result_double(context, p->rSum);
      }
    }else{
      sqlite3_result_int64(context, p->iSum);
    }
  }
}